

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
tcu::absDiff<unsigned_int,4>(tcu *this,Vector<unsigned_int,_4> *a,Vector<unsigned_int,_4> *b)

{
  uint uVar1;
  uint uVar2;
  int ndx;
  long lVar3;
  int iVar4;
  ulong extraout_RDX;
  ulong uVar5;
  Vector<unsigned_int,_4> VVar6;
  
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar5 = extraout_RDX;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar1 = b->m_data[lVar3];
    uVar2 = a->m_data[lVar3];
    uVar5 = (ulong)uVar2;
    iVar4 = uVar1 - uVar2;
    if (uVar1 < uVar2) {
      iVar4 = -(uVar1 - uVar2);
    }
    *(int *)(this + lVar3 * 4) = iVar4;
  }
  VVar6.m_data[2] = (int)uVar5;
  VVar6.m_data[3] = (int)(uVar5 >> 0x20);
  VVar6.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar6.m_data;
}

Assistant:

static inline Vector<T, Size> absDiff (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;

	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = (a[ndx] > b[ndx]) ? (a[ndx] - b[ndx]) : (b[ndx] - a[ndx]);

	return res;
}